

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.h
# Opt level: O0

MatcherBase<const_(anonymous_namespace)::enumeration_&> * __thiscall
testing::internal::MatcherBase<const_(anonymous_namespace)::enumeration_&>::operator=
          (MatcherBase<const_(anonymous_namespace)::enumeration_&> *this,
          MatcherBase<const_(anonymous_namespace)::enumeration_&> *other)

{
  MatcherBase<const_(anonymous_namespace)::enumeration_&> *other_local;
  MatcherBase<const_(anonymous_namespace)::enumeration_&> *this_local;
  
  if (this != other) {
    Destroy(this);
    this->vtable_ = other->vtable_;
    this->buffer_ = other->buffer_;
    other->vtable_ = (VTable *)0x0;
  }
  return this;
}

Assistant:

MatcherBase& operator=(MatcherBase&& other) {
    if (this == &other) return *this;
    Destroy();
    vtable_ = other.vtable_;
    buffer_ = other.buffer_;
    other.vtable_ = nullptr;
    return *this;
  }